

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.cpp
# Opt level: O0

void Omega_h::find_matches
               (Omega_h_Family family,Int dim,LOs *av2v,LOs *bv2v,Adj *v2b,Write<int> *a2b_out,
               Write<signed_char> *codes_out)

{
  Int deg_00;
  Int local_154;
  Int local_144;
  Int local_138;
  Int local_130;
  Int local_12c;
  Int local_128;
  Int local_118;
  Int local_10c;
  Int local_104;
  Adj local_e8;
  Read<int> local_b8;
  Read<int> local_a8;
  Read<int> local_98 [2];
  Read<int> local_78;
  undefined1 local_68 [8];
  Read<int> a2fv;
  Int deg;
  Write<int> *a2b_out_local;
  Adj *v2b_local;
  LOs *bv2v_local;
  LOs *av2v_local;
  Int dim_local;
  Omega_h_Family family_local;
  
  if (2 < dim) {
    fail("assertion %s failed at %s +%d\n","dim <= 2",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
         ,0x1a2);
  }
  if (family == OMEGA_H_SIMPLEX) {
    if (dim == 0) {
      local_104 = 1;
    }
    else {
      if (dim == 1) {
        local_10c = 2;
      }
      else {
        if (dim == 2) {
          local_118 = 3;
        }
        else {
          if (dim == 3) {
            local_128 = 4;
          }
          else {
            local_128 = -1;
          }
          local_118 = local_128;
        }
        local_10c = local_118;
      }
      local_104 = local_10c;
    }
    local_12c = local_104;
  }
  else {
    if (dim == 0) {
      local_130 = 1;
    }
    else {
      if (dim == 1) {
        local_138 = 2;
      }
      else {
        if (dim == 2) {
          local_144 = 4;
        }
        else {
          if (dim == 3) {
            local_154 = 8;
          }
          else {
            local_154 = -1;
          }
          local_144 = local_154;
        }
        local_138 = local_144;
      }
      local_130 = local_138;
    }
    local_12c = local_130;
  }
  a2fv.write_.shared_alloc_.direct_ptr._4_4_ = local_12c;
  Read<int>::Read(&local_78,av2v);
  get_component<int>((Omega_h *)local_68,&local_78,a2fv.write_.shared_alloc_.direct_ptr._4_4_,0);
  Read<int>::~Read(&local_78);
  deg_00 = a2fv.write_.shared_alloc_.direct_ptr._4_4_;
  Read<int>::Read(local_98,(Read<int> *)local_68);
  Read<int>::Read(&local_a8,av2v);
  Read<int>::Read(&local_b8,bv2v);
  Adj::Adj(&local_e8,v2b);
  find_matches_ex<int>(deg_00,local_98,&local_a8,&local_b8,&local_e8,a2b_out,codes_out,false);
  Adj::~Adj(&local_e8);
  Read<int>::~Read(&local_b8);
  Read<int>::~Read(&local_a8);
  Read<int>::~Read(local_98);
  Read<int>::~Read((Read<int> *)local_68);
  return;
}

Assistant:

void find_matches(Omega_h_Family const family, Int const dim, LOs const av2v,
    LOs const bv2v, Adj const v2b, Write<LO>* a2b_out, Write<I8>* codes_out) {
  OMEGA_H_CHECK(dim <= 2);
  auto const deg = element_degree(family, dim, VERT);
  auto const a2fv = get_component(av2v, deg, 0);
  find_matches_ex(deg, a2fv, av2v, bv2v, v2b, a2b_out, codes_out);
}